

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndFrame(void)

{
  ImVector<ImGuiWindow_*> *this;
  ImVec2 IVar1;
  uint uVar2;
  ImGuiNavLayer IVar3;
  _func_void_ImGuiViewport_ptr_ImGuiPlatformImeData_ptr *p_Var4;
  ImGuiViewportP *pIVar5;
  ImGuiContext *pIVar6;
  ImGuiContext *ctx;
  ImGuiContext *pIVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  ImVec2 in_RAX;
  ImGuiWindow *pIVar11;
  char *pcVar12;
  long lVar13;
  ImGuiContext *g;
  int iVar14;
  ImGuiDir clip_dir;
  int i;
  char *text;
  ulong uVar15;
  float fVar16;
  ImVec2 IVar17;
  ImVec2 IVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  ImVec2 local_38;
  
  ctx = GImGui;
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  local_38 = in_RAX;
  CallContextHooks(GImGui,ImGuiContextHookType_EndFramePre);
  pIVar6 = GImGui;
  iVar10 = (GImGui->CurrentWindowStack).Size;
  if (1 < iVar10) {
    while (1 < iVar10) {
      End();
      iVar10 = (pIVar6->CurrentWindowStack).Size;
    }
  }
  p_Var4 = (ctx->IO).SetPlatformImeDataFn;
  if ((p_Var4 != (_func_void_ImGuiViewport_ptr_ImGuiPlatformImeData_ptr *)0x0) &&
     (auVar21[0] = -((ctx->PlatformImeDataPrev).WantVisible == (ctx->PlatformImeData).WantVisible),
     auVar21[1] = -((ctx->PlatformImeDataPrev).field_0x1 == (ctx->PlatformImeData).field_0x1),
     auVar21[2] = -((ctx->PlatformImeDataPrev).field_0x2 == (ctx->PlatformImeData).field_0x2),
     auVar21[3] = -((ctx->PlatformImeDataPrev).field_0x3 == (ctx->PlatformImeData).field_0x3),
     auVar21[4] = -(*(char *)&(ctx->PlatformImeDataPrev).InputPos.x ==
                   *(char *)&(ctx->PlatformImeData).InputPos.x),
     auVar21[5] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.x + 1) ==
                   *(char *)((long)&(ctx->PlatformImeData).InputPos.x + 1)),
     auVar21[6] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.x + 2) ==
                   *(char *)((long)&(ctx->PlatformImeData).InputPos.x + 2)),
     auVar21[7] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.x + 3) ==
                   *(char *)((long)&(ctx->PlatformImeData).InputPos.x + 3)),
     auVar21[8] = -(*(char *)&(ctx->PlatformImeDataPrev).InputPos.y ==
                   *(char *)&(ctx->PlatformImeData).InputPos.y),
     auVar21[9] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.y + 1) ==
                   *(char *)((long)&(ctx->PlatformImeData).InputPos.y + 1)),
     auVar21[10] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.y + 2) ==
                    *(char *)((long)&(ctx->PlatformImeData).InputPos.y + 2)),
     auVar21[0xb] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.y + 3) ==
                     *(char *)((long)&(ctx->PlatformImeData).InputPos.y + 3)),
     auVar21[0xc] = -(*(char *)&(ctx->PlatformImeDataPrev).InputLineHeight ==
                     *(char *)&(ctx->PlatformImeData).InputLineHeight),
     auVar21[0xd] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputLineHeight + 1) ==
                     *(char *)((long)&(ctx->PlatformImeData).InputLineHeight + 1)),
     auVar21[0xe] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputLineHeight + 2) ==
                     *(char *)((long)&(ctx->PlatformImeData).InputLineHeight + 2)),
     auVar21[0xf] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputLineHeight + 3) ==
                     *(char *)((long)&(ctx->PlatformImeData).InputLineHeight + 3)),
     (ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe | (ushort)(auVar21[0xf] >> 7) << 0xf)
     != 0xffff)) {
    (*p_Var4)(&(*(GImGui->Viewports).Data)->super_ImGuiViewport,&ctx->PlatformImeData);
  }
  ctx->WithinFrameScopeWithImplicitWindow = false;
  pIVar11 = ctx->CurrentWindow;
  if ((pIVar11 != (ImGuiWindow *)0x0) && (pIVar11->WriteAccessed == false)) {
    pIVar11->Active = false;
  }
  End();
  pIVar6 = GImGui;
  if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      pIVar11 = FindWindowByName("###NavWindowingList");
      pIVar6->NavWindowingListWindow = pIVar11;
    }
    pIVar5 = *(pIVar6->Viewports).Data;
    uVar2 = (pIVar6->NextWindowData).Flags;
    IVar1 = (pIVar5->super_ImGuiViewport).Size;
    IVar17.x = IVar1.x * 0.2;
    IVar17.y = IVar1.y * 0.2;
    (pIVar6->NextWindowData).Flags = uVar2 | 0x10;
    (pIVar6->NextWindowData).SizeConstraintRect.Min = IVar17;
    (pIVar6->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar6->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar6->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar6->NextWindowData).SizeCallbackUserData = (void *)0x0;
    IVar1 = (pIVar5->super_ImGuiViewport).Size;
    IVar17 = (pIVar5->super_ImGuiViewport).Pos;
    IVar18.x = IVar1.x * 0.5 + IVar17.x;
    IVar18.y = IVar1.y * 0.5 + IVar17.y;
    (pIVar6->NextWindowData).Flags = uVar2 | 0x11;
    (pIVar6->NextWindowData).PosVal = IVar18;
    (pIVar6->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar6->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar6->NextWindowData).PosCond = 1;
    IVar1 = (pIVar6->Style).WindowPadding;
    fVar19 = IVar1.x;
    fVar22 = IVar1.y;
    local_38.x = fVar19 + fVar19;
    local_38.y = fVar22 + fVar22;
    PushStyleVar(2,&local_38);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    for (uVar15 = (ulong)(uint)(pIVar6->WindowsFocusOrder).Size; 0 < (int)uVar15;
        uVar15 = uVar15 - 1) {
      pIVar11 = (pIVar6->WindowsFocusOrder).Data[uVar15 - 1];
      bVar8 = IsWindowNavFocusable(pIVar11);
      if (bVar8) {
        text = pIVar11->Name;
        pcVar12 = FindRenderedTextEnd(text,(char *)0x0);
        if (text == pcVar12) {
          lVar13 = 0x5bd8;
          if (((uint)pIVar11->Flags >> 0x1a & 1) == 0) {
            if ((((uint)pIVar11->Flags >> 10 & 1) == 0) ||
               (iVar10 = strcmp(text,"##MainMenuBar"), iVar10 != 0)) {
              lVar13 = 0x5be0;
            }
            else {
              lVar13 = 0x5bd0;
            }
          }
          text = *(char **)(&GImGui->Initialized + lVar13);
          if (text == (char *)0x0) {
            text = "*Missing Text*";
          }
        }
        local_38.x = 0.0;
        local_38.y = 0.0;
        Selectable(text,pIVar6->NavWindowingTarget == pIVar11,0,&local_38);
      }
    }
    End();
    PopStyleVar(1);
  }
  if (((pIVar6->NavWindow != (ImGuiWindow *)0x0) &&
      (bVar8 = NavMoveRequestButNoResultYet(), pIVar7 = GImGui, bVar8)) &&
     (-1 < (char)pIVar6->NavMoveFlags && (pIVar6->NavMoveFlags & 0xfU) != 0)) {
    pIVar11 = GImGui->NavWindow;
    IVar3 = GImGui->NavLayer;
    fVar22 = pIVar11->NavRectRel[IVar3].Min.x;
    fVar19 = pIVar11->NavRectRel[IVar3].Min.y;
    fVar16 = pIVar11->NavRectRel[IVar3].Max.x;
    fVar20 = pIVar11->NavRectRel[IVar3].Max.y;
    iVar10 = GImGui->NavMoveDir;
    uVar2 = GImGui->NavMoveFlags;
    if (iVar10 == 0) {
      iVar14 = 0;
      clip_dir = 0;
      if ((uVar2 & 5) == 0) {
        bVar8 = false;
      }
      else {
        fVar22 = (pIVar11->ContentSize).x + (pIVar11->WindowPadding).x;
        bVar8 = true;
        if ((uVar2 & 4) == 0) goto LAB_001ce7cd;
        fVar16 = fVar20 - fVar19;
        fVar19 = fVar19 - fVar16;
        fVar20 = fVar20 - fVar16;
        clip_dir = 2;
        fVar16 = fVar22;
      }
    }
    else if (iVar10 == 1 && (uVar2 & 5) != 0) {
      fVar22 = -(pIVar11->WindowPadding).x;
      if ((uVar2 & 4) == 0) {
        iVar14 = 1;
      }
      else {
        fVar16 = fVar20 - fVar19;
        fVar19 = fVar19 + fVar16;
        fVar20 = fVar20 + fVar16;
        iVar14 = 3;
      }
LAB_001ce7cd:
      bVar8 = true;
      clip_dir = iVar14;
      fVar16 = fVar22;
    }
    else {
      bVar8 = false;
      clip_dir = iVar10;
    }
    if ((uVar2 & 10) == 0 || iVar10 != 2) {
      if (iVar10 == 3 && (uVar2 & 10) != 0) {
        fVar20 = -(pIVar11->WindowPadding).y;
        fVar19 = fVar20;
        if ((uVar2 & 8) != 0) {
          fVar23 = fVar16 - fVar22;
          fVar22 = fVar22 + fVar23;
          fVar16 = fVar16 + fVar23;
          clip_dir = 1;
        }
      }
      else if (!bVar8) goto LAB_001ce87a;
    }
    else {
      fVar20 = (pIVar11->ContentSize).y + (pIVar11->WindowPadding).y;
      fVar19 = fVar20;
      if ((uVar2 & 8) != 0) {
        fVar23 = fVar16 - fVar22;
        fVar22 = fVar22 - fVar23;
        fVar16 = fVar16 - fVar23;
        clip_dir = 0;
      }
    }
    pIVar11->NavRectRel[IVar3].Min.x = fVar22;
    pIVar11->NavRectRel[IVar3].Min.y = fVar19;
    pIVar11->NavRectRel[IVar3].Max.x = fVar16;
    pIVar11->NavRectRel[IVar3].Max.y = fVar20;
    NavMoveRequestForward(pIVar7->NavMoveDir,clip_dir,uVar2,pIVar7->NavMoveScrollFlags);
  }
LAB_001ce87a:
  if (ctx->DragDropActive != true) goto LAB_001ce8c2;
  bVar8 = (ctx->DragDropPayload).Delivery;
  if ((ctx->DragDropPayload).DataFrameCount + 1 < ctx->FrameCount) {
    if ((ctx->DragDropSourceFlags & 0x20) == 0) {
      bVar9 = IsMouseDown(ctx->DragDropMouseButton);
      bVar9 = !bVar9;
      goto LAB_001ce8b4;
    }
  }
  else {
    bVar9 = false;
LAB_001ce8b4:
    if ((!bVar9) && (bVar8 == false)) goto LAB_001ce8c2;
  }
  ClearDragDrop();
LAB_001ce8c2:
  iVar10 = ctx->FrameCount;
  if (((ctx->DragDropActive == true) && (ctx->DragDropSourceFrameCount < iVar10)) &&
     ((ctx->DragDropSourceFlags & 1) == 0)) {
    ctx->DragDropWithinSource = true;
    SetTooltip("...");
    ctx->DragDropWithinSource = false;
    iVar10 = ctx->FrameCount;
  }
  ctx->WithinFrameScope = false;
  ctx->FrameCountEnded = iVar10;
  UpdateMouseMovingWindowEndFrame();
  this = &ctx->WindowsTempSortBuffer;
  ImVector<ImGuiWindow_*>::resize(this,0);
  ImVector<ImGuiWindow_*>::reserve(this,(ctx->Windows).Size);
  for (uVar15 = 0; uVar15 != (uint)(ctx->Windows).Size; uVar15 = uVar15 + 1) {
    pIVar11 = (ctx->Windows).Data[uVar15];
    if ((pIVar11->Active != true) || ((pIVar11->Flags & 0x1000000) == 0)) {
      AddWindowToSortBuffer(this,pIVar11);
    }
  }
  ImVector<ImGuiWindow_*>::swap(&ctx->Windows,this);
  (ctx->IO).MetricsActiveWindows = ctx->WindowsActiveCount;
  ((ctx->IO).Fonts)->Locked = false;
  (ctx->IO).AppFocusLost = false;
  (ctx->IO).MouseWheel = 0.0;
  (ctx->IO).MouseWheelH = 0.0;
  ImVector<unsigned_short>::resize(&(ctx->IO).InputQueueCharacters,0);
  CallContextHooks(ctx,ImGuiContextHookType_EndFramePost);
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify Platform/OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.SetPlatformImeDataFn && memcmp(&g.PlatformImeData, &g.PlatformImeDataPrev, sizeof(ImGuiPlatformImeData)) != 0)
        g.IO.SetPlatformImeDataFn(GetMainViewport(), &g.PlatformImeData);

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.AppFocusLost = false;
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}